

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualMaterial.cpp
# Opt level: O1

void __thiscall chrono::ChVisualMaterial::SetAmbientColor(ChVisualMaterial *this,ChColor *rgb)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = rgb->R;
  if ((((0.0 <= fVar1) && (fVar2 = rgb->G, 0.0 <= fVar2)) && ((ChVisualMaterial *)rgb != this)) &&
     (((fVar3 = rgb->B, fVar3 <= 1.0 && (fVar2 <= 1.0)) && ((fVar1 <= 1.0 && (0.0 <= fVar3)))))) {
    (this->Ka).R = fVar1;
    (this->Ka).G = fVar2;
    (this->Ka).B = fVar3;
  }
  return;
}

Assistant:

void ChVisualMaterial::SetAmbientColor(const ChColor& rgb) {
    // valid rgb range [0,1]
    if (rgb.R >= 0 && rgb.G >= 0 && rgb.B >= 0 && rgb.R <= 1 && rgb.G <= 1 && rgb.B <= 1) {
        Ka = rgb;
    }
}